

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O0

void Promise::TickAll(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  reference pvVar4;
  element_type *peVar5;
  __normal_iterator<std::shared_ptr<Promise>_*,_std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>_>
  local_78;
  const_iterator local_70;
  const_iterator local_68;
  shared_ptr<Promise> *local_58;
  shared_ptr<Promise> *local_50;
  __normal_iterator<std::shared_ptr<Promise>_*,_std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>_>
  local_48;
  __normal_iterator<std::shared_ptr<Promise>_*,_std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>_>
  it;
  size_type size;
  undefined1 local_20 [8];
  shared_ptr<Promise> promise;
  size_t i;
  
  for (promise.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var1._M_pi = promise.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi,
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::
               size(&entries), _Var1._M_pi < p_Var3;
      promise.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(promise.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + 1)) {
    pvVar4 = std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::at
                       (&entries,(size_type)
                                 promise.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
    std::shared_ptr<Promise>::shared_ptr((shared_ptr<Promise> *)local_20,pvVar4);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
    if (bVar2) {
      peVar5 = std::__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_20);
      bVar2 = IsReadyToExecute(peVar5);
      if (bVar2) {
        peVar5 = std::__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_20);
        (**peVar5->_vptr_Promise)();
      }
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
      if (bVar2) {
        peVar5 = std::__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_20);
        bVar2 = IsDone(peVar5);
        if (bVar2) {
          peVar5 = std::__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_20);
          std::__shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>::reset
                    (&(peVar5->parent).super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>);
        }
      }
    }
    std::shared_ptr<Promise>::~shared_ptr((shared_ptr<Promise> *)local_20);
  }
  it._M_current =
       (shared_ptr<Promise> *)
       std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::size
                 (&entries);
  local_50 = (shared_ptr<Promise> *)
             std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::
             begin(&entries);
  local_58 = (shared_ptr<Promise> *)
             std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::end
                       (&entries);
  local_48 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Promise>*,std::vector<std::shared_ptr<Promise>,std::allocator<std::shared_ptr<Promise>>>>,Promise::TickAll()::_lambda(std::shared_ptr<Promise>const&)_1_>
                       (local_50,local_58);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<Promise>const*,std::vector<std::shared_ptr<Promise>,std::allocator<std::shared_ptr<Promise>>>>
  ::__normal_iterator<std::shared_ptr<Promise>*>
            ((__normal_iterator<std::shared_ptr<Promise>const*,std::vector<std::shared_ptr<Promise>,std::allocator<std::shared_ptr<Promise>>>>
              *)&local_68,&local_48);
  local_78._M_current =
       (shared_ptr<Promise> *)
       std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::end
                 (&entries);
  __gnu_cxx::
  __normal_iterator<std::shared_ptr<Promise>const*,std::vector<std::shared_ptr<Promise>,std::allocator<std::shared_ptr<Promise>>>>
  ::__normal_iterator<std::shared_ptr<Promise>*>
            ((__normal_iterator<std::shared_ptr<Promise>const*,std::vector<std::shared_ptr<Promise>,std::allocator<std::shared_ptr<Promise>>>>
              *)&local_70,&local_78);
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::erase
            (&entries,local_68,local_70);
  std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::size(&entries);
  return;
}

Assistant:

static void TickAll() {
    for (size_t i = 0; i < entries.size(); i++) { // NOLINT(modernize-loop-convert)
      PromisePtr promise = entries.at(i);
      if (!promise) continue;
      if (promise->IsReadyToExecute()) {
        promise->Tick();
      }

      if (promise && promise->IsDone()) {
        promise->parent.reset();
      }
    }

    const auto size = entries.size();
    const auto it = std::remove_if(entries.begin(), entries.end(),
                                   [](const PromisePtr& promise) {
                                     return !promise || promise->IsDone();
                                   });
    entries.erase(it, entries.end());

    if (size != entries.size()) {
      DEBUG("Cleaned up the vector: %u -> %u\n", size, entries.size());
    }
  }